

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPTCPTransmitter::GetLocalHostName
          (RTPTCPTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  pointer puVar1;
  int iVar2;
  size_t __n;
  
  iVar2 = -0xb5;
  if ((this->m_init == true) && (iVar2 = -0xbb, this->m_created == true)) {
    if ((this->m_localHostname).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->m_localHostname).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_localHostname,9);
      puVar1 = (this->m_localHostname).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar1,"localhost",
             (long)(this->m_localHostname).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1);
    }
    puVar1 = (this->m_localHostname).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)(this->m_localHostname).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
    iVar2 = -0x45;
    if (__n <= *bufferlength) {
      memcpy(buffer,puVar1,__n);
      __n = (long)(this->m_localHostname).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_localHostname).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iVar2 = 0;
    }
    *bufferlength = __n;
  }
  return iVar2;
}

Assistant:

int RTPTCPTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	if (m_localHostname.size() == 0)
	{
		//
		// TODO
		// TODO
		// TODO
		// TODO
		//
		m_localHostname.resize(9);
		memcpy(&m_localHostname[0], "localhost", m_localHostname.size());
	}
	
	if ((*bufferlength) < m_localHostname.size())
	{
		*bufferlength = m_localHostname.size(); // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,&m_localHostname[0], m_localHostname.size());
	*bufferlength = m_localHostname.size();
	
	MAINMUTEX_UNLOCK
	return 0;
}